

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O3

conspage * next_conspage(void)

{
  conspage *pcVar1;
  uint uVar2;
  conspage *pcVar3;
  ulong uVar4;
  long lVar5;
  LispPTR LVar6;
  uint uVar7;
  conspage *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pcVar3 = (conspage *)alloc_mdspage(5);
  pcVar1 = pcVar3 + 0x20;
  pcVar3[0x20].field_0xa = 0xf8;
  auVar18 = _DAT_00143d70;
  auVar17 = _DAT_00143d60;
  auVar16 = _DAT_00143d50;
  auVar15 = _DAT_00143d40;
  iVar9 = 0xfe;
  iVar10 = 0xfc;
  iVar11 = 0xfa;
  iVar12 = 0xf8;
  uVar2 = 0;
  lVar5 = 0x1fe;
  do {
    if ((int)(uVar2 ^ auVar16._0_4_) < auVar17._0_4_) {
      *(uint *)((long)pcVar3 + lVar5 * 2 + -0xc) = (iVar9 + auVar18._0_4_ ^ 6U) << 0x18;
    }
    auVar13._4_4_ = uVar2;
    auVar13._0_4_ = uVar2;
    auVar13._8_4_ = uVar2;
    auVar13._12_4_ = uVar2;
    auVar13 = (auVar13 | auVar15) ^ auVar16;
    if (auVar13._4_4_ < auVar17._4_4_) {
      *(uint *)((long)&pcVar1->cell6 + (ulong)((int)lVar5 - 0x102U ^ 6) * 2) =
           (iVar10 + auVar18._4_4_ ^ 6U) << 0x18;
    }
    if (auVar13._8_4_ < auVar17._8_4_) {
      *(uint *)((long)&pcVar1->cell6 + (ulong)((int)lVar5 - 0x104U ^ 6) * 2) =
           (iVar11 + auVar18._8_4_ ^ 6U) << 0x18;
    }
    if (auVar13._12_4_ < auVar17._12_4_) {
      *(uint *)((long)&pcVar3->cell6 + lVar5 * 2) = (iVar12 + auVar18._12_4_ & 0xfffffff8U) << 0x18;
    }
    uVar2 = uVar2 + 4;
    iVar9 = iVar9 + -8;
    iVar10 = iVar10 + -8;
    iVar11 = iVar11 + -8;
    iVar12 = iVar12 + -8;
    lVar5 = lVar5 + -8;
  } while (uVar2 != 0x7c);
  uVar2 = 0;
  pcVar3[0x21].next_page = 0;
  pcVar3[0x20].field_0xb = 0x7c;
  pcVar3[0x20].next_page = 0;
  if (((ulong)pcVar1 & 1) != 0) {
    printf("Misaligned pointer in LPageFromNative %p\n",pcVar1);
    auVar15 = _DAT_00143d40;
    auVar16 = _DAT_00143d50;
    auVar17 = _DAT_00143d60;
    auVar18 = _DAT_00143d70;
  }
  uVar4 = (long)pcVar1 - (long)Lisp_world;
  pcVar3->field_0xa = 0xf8;
  iVar9 = 0xfe;
  iVar10 = 0xfc;
  iVar11 = 0xfa;
  iVar12 = 0xf8;
  lVar5 = 0xfe;
  do {
    if ((int)(uVar2 ^ auVar16._0_4_) < auVar17._0_4_) {
      *(uint *)((long)pcVar3 + lVar5 * 2 + -0xc) = (iVar9 + auVar18._0_4_ ^ 6U) << 0x18;
    }
    auVar14._4_4_ = uVar2;
    auVar14._0_4_ = uVar2;
    auVar14._8_4_ = uVar2;
    auVar14._12_4_ = uVar2;
    auVar13 = (auVar14 | auVar15) ^ auVar16;
    if (auVar13._4_4_ < auVar17._4_4_) {
      *(uint *)((long)&pcVar3->cell6 + (ulong)((int)lVar5 - 2U ^ 6) * 2) =
           (iVar10 + auVar18._4_4_ ^ 6U) << 0x18;
    }
    if (auVar13._8_4_ < auVar17._8_4_) {
      *(uint *)((long)&pcVar3->cell6 + (ulong)((int)lVar5 - 4U ^ 6) * 2) =
           (iVar11 + auVar18._8_4_ ^ 6U) << 0x18;
    }
    if (auVar13._12_4_ < auVar17._12_4_) {
      *(uint *)((long)&pcVar3->cell6 + lVar5 * 2) = (iVar12 + auVar18._12_4_ & 0xfffffff8U) << 0x18;
    }
    uVar2 = uVar2 + 4;
    iVar9 = iVar9 + -8;
    iVar10 = iVar10 + -8;
    iVar11 = iVar11 + -8;
    iVar12 = iVar12 + -8;
    lVar5 = lVar5 + -8;
  } while ((int)lVar5 != 6);
  pcVar3[1].next_page = 0;
  pcVar3->field_0xb = 0x7c;
  pcVar3->next_page = (LispPTR)(uVar4 >> 9);
  LVar6 = ListpDTD->dtd_nextpage;
  uVar2 = LVar6 + 1;
  if (uVar2 < 2) {
    pcVar8 = (conspage *)0x0;
  }
  else {
    do {
      uVar7 = LVar6 << 8;
      LVar6 = *(LispPTR *)(Lisp_world + (ulong)uVar7 + 6);
    } while (LVar6 - 1 < 0xfffffffe);
    pcVar8 = (conspage *)(Lisp_world + uVar7);
    if (1 < uVar2) {
      if (((ulong)pcVar3 & 1) != 0) {
        printf("Misaligned pointer in LPageFromNative %p\n",pcVar3);
      }
      pcVar8->next_page = (LispPTR)((ulong)((long)pcVar3 - (long)Lisp_world) >> 9);
      goto LAB_001147ef;
    }
  }
  if (((ulong)pcVar3 & 1) != 0) {
    printf("Misaligned pointer in LPageFromNative %p\n",pcVar3);
  }
  ListpDTD->dtd_nextpage = (LispPTR)((ulong)((long)pcVar3 - (long)Lisp_world) >> 9);
LAB_001147ef:
  if (pcVar3[0x20].next_page != 0) {
    error("page2 has a next page??");
  }
  if (pcVar1 == pcVar8) {
    error("loop in conspage next_pages");
  }
  return pcVar3;
}

Assistant:

struct conspage *next_conspage(void) {
  struct conspage *page1; /* Allocated 1st MDS page */
  struct conspage *page2; /* Allocated 2nd MDS page */
  struct conspage *pg, *priorpg;
  LispPTR next, prior;

#ifdef NEWCDRCODING
  /* Allocate 2 conspages and get 1st page base */
  page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);
  /* Calculate next conspage's base address */
  page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

  init_conspage(page2, 0); /* No next page */
  init_conspage(page1, LPageFromNative(page2));

  priorpg = NULL;
  prior = 0;
  for (pg = (struct conspage *)NativeAligned4FromLPage(next = ListpDTD->dtd_nextpage);
       next && (next != CONSPAGE_LAST);
       pg = (struct conspage *)NativeAligned4FromLPage(next = pg->next_page)) {
    priorpg = pg;
    prior = next;
  }

  if (prior)
    priorpg->next_page = LPageFromNative(page1);
  else
    ListpDTD->dtd_nextpage = LPageFromNative(page1);

  if (page2->next_page) error("page2 has a next page??");
  if (page2 == priorpg) error("loop in conspage next_pages");
#else
  for (next = (int)ListpDTD->dtd_nextpage; /* /!\ Note no exit condition /!\ */ /* get next free conspage */
       ; ListpDTD->dtd_nextpage = next = page1->next_page, page1->next_page = 0xffff) {
    if (next == 0) {
      /* Allocate 2 conspages and get 1st page base */
      page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);

      /* Calculate next conspage's base address */
      page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

      /* XXX: why is the link for page2's next here?
       * when it was previously commented as "Doesn't exist next page"
       */
      init_conspage(page2, ListpDTD->dtd_nextpage);
      init_conspage(page1, LPageFromNative(page2));

      ListpDTD->dtd_nextpage = LPageFromNative(page1);
      goto ex; /* replaced break */
    } else {
      page1 = (struct conspage *)NativeAligned4FromLPage(next); /*Jan-21*/
    }

    if (page1->count > 1) break;

  } /* for loop end */
#endif /* NEWCDRCODING */
ex:
  return (page1);
}